

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XIncludeUtils::reportError
          (XIncludeUtils *this,DOMNode *param_1,Codes errorType,XMLCh *errorMsg,XMLCh *href)

{
  ulong uVar1;
  XMLCh errText [1024];
  undefined1 local_818 [2048];
  
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    if (errorMsg == (XMLCh *)0x0) {
      (**(code **)(*gMsgLoader + 0x10))(gMsgLoader,errorType,local_818,0x3ff,0);
    }
    else {
      (**(code **)(*gMsgLoader + 0x18))
                (gMsgLoader,errorType,local_818,0x3ff,errorMsg,0,0,0,
                 XMLPlatformUtils::fgMemoryManager);
    }
    uVar1 = 0;
    if ((10 < errorType - W_LowBounds) && (uVar1 = 2, 0x84 < errorType - F_LowBounds)) {
      uVar1 = (ulong)((uint)(0x8e < errorType - E_LowBounds) * 2 + 1);
    }
    (*this->fErrorReporter->_vptr_XMLErrorReporter[2])
              (this->fErrorReporter,(ulong)errorType,&XMLUni::fgXMLErrDomain,uVar1,local_818,href,
               href,0,0);
  }
  if (errorType - F_LowBounds < 0x85) {
    this->fErrorCount = this->fErrorCount + 1;
  }
  return true;
}

Assistant:

bool
XIncludeUtils::reportError(const DOMNode* const    /*errorNode*/
                              , XMLErrs::Codes errorType
                              , const XMLCh*   const    errorMsg
                              , const XMLCh * const href)
{
    bool toContinueProcess = true;   /* default value for no error handler */

    const XMLCh* const                    systemId = href;
    const XMLCh* const                    publicId = href;
    /* TODO - look these up somehow? */
    const XMLFileLoc                 lineNum = 0;
    const XMLFileLoc                 colNum = 0;

    if (fErrorReporter)
    {
        // Load the message into a local for display
        const XMLSize_t msgSize = 1023;
        XMLCh errText[msgSize + 1];

        if (errorMsg == NULL){
            if (gMsgLoader->loadMsg(errorType, errText, msgSize))
            {
                    // <TBD> Probably should load a default msg here
            }
        } else {
            if (gMsgLoader->loadMsg(errorType, errText, msgSize, errorMsg))
            {
                    // <TBD> Probably should load a default msg here
            }
        }

        fErrorReporter->error(errorType
                              , XMLUni::fgXMLErrDomain
                              , XMLErrs::errorType(errorType)
                              , errText
                              , systemId
                              , publicId
                              , lineNum
                              , colNum);
    }

    if (XMLErrs::isFatal(errorType))
        fErrorCount++;

    return toContinueProcess;
}